

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

void __thiscall QUtcTimeZonePrivate::~QUtcTimeZonePrivate(QUtcTimeZonePrivate *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->m_comment).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_comment).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_abbreviation).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_abbreviation).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_name).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_name).d.d)->super_QArrayData,2,0x10);
    }
  }
  QTimeZonePrivate::~QTimeZonePrivate(&this->super_QTimeZonePrivate);
  return;
}

Assistant:

QUtcTimeZonePrivate::~QUtcTimeZonePrivate()
{
}